

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedate.c
# Opt level: O1

int parsedate(char *date,time_t *output)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int *piVar6;
  int i;
  int iVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  char **what;
  char **ppcVar11;
  long lVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  int secnum;
  int len;
  int minnum;
  int hournum;
  char buf [32];
  uint local_94;
  int local_90;
  int local_8c;
  byte *local_88;
  int local_7c;
  int local_78;
  int local_74;
  ulong local_70;
  byte *local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  long *local_40;
  byte *local_38;
  
  local_74 = -1;
  local_78 = -1;
  local_70 = 0xffffffff;
  local_90 = -1;
  iVar10 = -1;
  bVar15 = false;
  local_94 = 0xffffffff;
  iVar4 = 0;
  iVar7 = -1;
  lVar9 = 0xffffffff;
  local_40 = output;
  local_38 = (byte *)date;
  do {
    bVar1 = *date;
    if ((bVar1 == 0) || (5 < iVar4)) {
      if (local_90 == -1) {
        local_74 = 0;
        local_78 = 0;
        local_90 = 0;
      }
      if (local_94 == 0xffffffff) {
        return -1;
      }
      if (iVar7 == -1) {
        return -1;
      }
      if ((int)local_70 < 0x62f) {
        return -1;
      }
      if ((0x3c < local_90 || 0x3b < local_78) ||
          (0x17 < local_74 || (0xb < iVar7 || 0x1f < (int)local_94))) {
        return -1;
      }
      uVar5 = (int)local_70 - (uint)(iVar7 < 2);
      if (iVar10 == -1) {
        iVar10 = 0;
      }
      *local_40 = (((long)local_74 +
                   ((long)(int)local_94 + (long)((int)local_70 + -0x7b2) * 0x16d +
                    (long)*(int *)(time2epoch_month_days_cumulative + (long)iVar7 * 4) +
                   (long)(int)(uVar5 / 400 + ((uVar5 >> 2) - uVar5 / 100) + -0x1dd)) * 0x18) * 0x3c
                  + (long)local_78) * 0x3c + (long)iVar10 + (long)local_90 + -0x15180;
      return 0;
    }
    if (((byte)(bVar1 - 0x3a) < 0xf6) && ((byte)((bVar1 & 0xdf) + 0xa5) < 0xe6)) {
      while( true ) {
        bVar1 = ((byte *)date)[1];
        date = (char *)((byte *)date + 1);
        if (0xe5 < (byte)((bVar1 & 0xdf) + 0xa5)) break;
        if ((bVar1 == 0) || (0xf5 < (byte)(bVar1 - 0x3a))) break;
      }
    }
    if ((byte)((*date & 0xdfU) + 0xbf) < 0x1a) {
      local_58 = 0;
      uStack_50 = 0;
      local_68 = (byte *)0x0;
      uStack_60 = 0;
      iVar3 = __isoc99_sscanf(date,"%31[ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz]",
                              &local_68);
      if (iVar3 == 0) {
        local_88 = (byte *)0x0;
      }
      else {
        local_88 = (byte *)strlen((char *)&local_68);
      }
      if ((int)lVar9 == -1) {
        ppcVar11 = Curl_wkday;
        if ((byte *)0x3 < local_88) {
          ppcVar11 = weekday;
        }
        lVar9 = 0;
        local_8c = iVar4;
        do {
          iVar4 = Curl_strcasecompare((char *)&local_68,ppcVar11[lVar9]);
          if (iVar4 != 0) goto LAB_0051eeaf;
          lVar9 = lVar9 + 1;
        } while ((int)lVar9 != 7);
        lVar9 = 0xffffffff;
LAB_0051eeaf:
        bVar14 = (int)lVar9 != -1;
      }
      else {
        bVar14 = false;
        local_8c = iVar4;
      }
      if ((!bVar14) && (iVar7 == -1)) {
        iVar7 = 0;
        ppcVar11 = Curl_month;
        do {
          iVar4 = Curl_strcasecompare((char *)&local_68,*ppcVar11);
          if (iVar4 != 0) goto LAB_0051eef1;
          ppcVar11 = ppcVar11 + 1;
          iVar7 = iVar7 + 1;
        } while (iVar7 != 0xc);
        iVar7 = -1;
LAB_0051eef1:
        bVar14 = iVar7 != -1;
      }
      if ((!bVar14) && (iVar10 == -1)) {
        lVar12 = 0;
        do {
          iVar4 = Curl_strcasecompare((char *)&local_68,tz[0].name + lVar12);
          if (iVar4 != 0) {
            iVar10 = *(int *)(tz[0].name + lVar12 + 8) * 0x3c;
            goto LAB_0051f07c;
          }
          lVar12 = lVar12 + 0xc;
        } while ((int)lVar12 != 0x33c);
        iVar10 = -1;
LAB_0051f07c:
        bVar14 = iVar10 != -1;
      }
      iVar4 = local_8c;
      if (bVar14) {
        date = (char *)((byte *)date + (long)local_88);
LAB_0051f1eb:
        bVar14 = true;
        iVar4 = iVar4 + 1;
      }
      else {
        bVar14 = false;
      }
    }
    else {
      if (9 < (byte)(*date - 0x30U)) goto LAB_0051f1eb;
      local_7c = 0;
      if ((local_90 == -1) &&
         (iVar3 = __isoc99_sscanf(date,"%02d:%02d:%02d%n",&local_74,&local_78,&local_90,&local_7c),
         iVar3 == 3)) {
LAB_0051ee51:
        date = (char *)((byte *)date + local_7c);
        bVar14 = true;
      }
      else {
        if ((local_90 == -1) &&
           (iVar3 = __isoc99_sscanf(date,"%02d:%02d%n",&local_74,&local_78,&local_7c), iVar3 == 2))
        {
          local_90 = 0;
          goto LAB_0051ee51;
        }
        local_88 = (byte *)CONCAT44(local_88._4_4_,iVar10);
        local_8c = iVar4;
        piVar6 = __errno_location();
        iVar10 = *piVar6;
        *piVar6 = 0;
        lVar12 = strtol(date,(char **)&local_68,10);
        iVar4 = local_8c;
        iVar3 = *piVar6;
        if (iVar3 != iVar10) {
          *piVar6 = iVar10;
        }
        bVar14 = false;
        iVar10 = (int)local_88;
        if ((iVar3 == 0) && (0xfffffffeffffffff < lVar12 - 0x80000000U)) {
          uVar5 = curlx_sltosi(lVar12);
          if (iVar10 == -1) {
            iVar10 = -1;
            bVar2 = false;
            if (((local_38 < date) && (bVar2 = false, (long)local_68 - (long)date == 4)) &&
               (bVar2 = false, (int)uVar5 < 0x579)) {
              bVar1 = ((byte *)date)[-1];
              if ((bVar1 != 0x2d) && (bVar1 != 0x2b)) goto LAB_0051efd0;
              iVar3 = uVar5 + ((int)uVar5 / 100) * -0x28;
              iVar10 = iVar3 * -0x3c;
              if (bVar1 != 0x2b) {
                iVar10 = iVar3 * 0x3c;
              }
              bVar2 = true;
            }
          }
          else {
LAB_0051efd0:
            bVar2 = false;
          }
          local_88 = local_68;
          if ((((long)local_68 - (long)date == 8) && ((int)local_70 == -1)) &&
             ((iVar7 == -1 && (local_94 == 0xffffffff)))) {
            local_70 = (ulong)(uint)((int)uVar5 / 10000);
            iVar7 = ((int)uVar5 % 10000) / 100 + -1;
            local_94 = (int)uVar5 % 100;
            bVar2 = true;
          }
          bVar13 = uVar5 - 1 < 0x1f;
          uVar8 = 0xffffffff;
          if (bVar13) {
            uVar8 = uVar5;
          }
          bVar14 = bVar2;
          if (bVar13) {
            bVar14 = true;
          }
          bVar13 = true;
          if (!(bool)(!bVar15 & ~bVar2 & local_94 == 0xffffffff)) {
            bVar14 = bVar2;
            uVar8 = local_94;
            bVar13 = bVar15;
          }
          bVar15 = bVar13;
          local_94 = uVar8;
          if (((!bVar14) && (bVar15)) && ((int)local_70 == -1)) {
            if ((int)uVar5 < 100) {
              if ((int)uVar5 < 0x47) {
                uVar5 = uVar5 + 2000;
              }
              else {
                uVar5 = uVar5 + 0x76c;
              }
            }
            local_70 = (ulong)uVar5;
            bVar15 = local_94 != 0xffffffff;
            bVar14 = true;
          }
          if (bVar14) {
            date = (char *)local_68;
          }
        }
      }
      if (bVar14) goto LAB_0051f1eb;
      bVar14 = false;
    }
    if (!bVar14) {
      return -1;
    }
  } while( true );
}

Assistant:

static int parsedate(const char *date, time_t *output)
{
  time_t t = 0;
  int wdaynum = -1;  /* day of the week number, 0-6 (mon-sun) */
  int monnum = -1;   /* month of the year number, 0-11 */
  int mdaynum = -1; /* day of month, 1 - 31 */
  int hournum = -1;
  int minnum = -1;
  int secnum = -1;
  int yearnum = -1;
  int tzoff = -1;
  enum assume dignext = DATE_MDAY;
  const char *indate = date; /* save the original pointer */
  int part = 0; /* max 6 parts */

  while(*date && (part < 6)) {
    bool found = FALSE;

    skip(&date);

    if(ISALPHA(*date)) {
      /* a name coming up */
      char buf[32]="";
      size_t len;
      if(sscanf(date, "%31[ABCDEFGHIJKLMNOPQRSTUVWXYZ"
                          "abcdefghijklmnopqrstuvwxyz]", buf))
        len = strlen(buf);
      else
        len = 0;

      if(wdaynum == -1) {
        wdaynum = checkday(buf, len);
        if(wdaynum != -1)
          found = TRUE;
      }
      if(!found && (monnum == -1)) {
        monnum = checkmonth(buf);
        if(monnum != -1)
          found = TRUE;
      }

      if(!found && (tzoff == -1)) {
        /* this just must be a time zone string */
        tzoff = checktz(buf);
        if(tzoff != -1)
          found = TRUE;
      }

      if(!found)
        return PARSEDATE_FAIL; /* bad string */

      date += len;
    }
    else if(ISDIGIT(*date)) {
      /* a digit */
      int val;
      char *end;
      int len = 0;
      if((secnum == -1) &&
         (3 == sscanf(date, "%02d:%02d:%02d%n",
                      &hournum, &minnum, &secnum, &len))) {
        /* time stamp! */
        date += len;
      }
      else if((secnum == -1) &&
              (2 == sscanf(date, "%02d:%02d%n", &hournum, &minnum, &len))) {
        /* time stamp without seconds */
        date += len;
        secnum = 0;
      }
      else {
        long lval;
        int error;
        int old_errno;

        old_errno = errno;
        errno = 0;
        lval = strtol(date, &end, 10);
        error = errno;
        if(errno != old_errno)
          errno = old_errno;

        if(error)
          return PARSEDATE_FAIL;

#if LONG_MAX != INT_MAX
        if((lval > (long)INT_MAX) || (lval < (long)INT_MIN))
          return PARSEDATE_FAIL;
#endif

        val = curlx_sltosi(lval);

        if((tzoff == -1) &&
           ((end - date) == 4) &&
           (val <= 1400) &&
           (indate< date) &&
           ((date[-1] == '+' || date[-1] == '-'))) {
          /* four digits and a value less than or equal to 1400 (to take into
             account all sorts of funny time zone diffs) and it is preceded
             with a plus or minus. This is a time zone indication.  1400 is
             picked since +1300 is frequently used and +1400 is mentioned as
             an edge number in the document "ISO C 200X Proposal: Timezone
             Functions" at http://david.tribble.com/text/c0xtimezone.html If
             anyone has a more authoritative source for the exact maximum time
             zone offsets, please speak up! */
          found = TRUE;
          tzoff = (val/100 * 60 + val%100)*60;

          /* the + and - prefix indicates the local time compared to GMT,
             this we need their reversed math to get what we want */
          tzoff = date[-1]=='+'?-tzoff:tzoff;
        }

        if(((end - date) == 8) &&
           (yearnum == -1) &&
           (monnum == -1) &&
           (mdaynum == -1)) {
          /* 8 digits, no year, month or day yet. This is YYYYMMDD */
          found = TRUE;
          yearnum = val/10000;
          monnum = (val%10000)/100-1; /* month is 0 - 11 */
          mdaynum = val%100;
        }

        if(!found && (dignext == DATE_MDAY) && (mdaynum == -1)) {
          if((val > 0) && (val<32)) {
            mdaynum = val;
            found = TRUE;
          }
          dignext = DATE_YEAR;
        }

        if(!found && (dignext == DATE_YEAR) && (yearnum == -1)) {
          yearnum = val;
          found = TRUE;
          if(yearnum < 100) {
            if(yearnum > 70)
              yearnum += 1900;
            else
              yearnum += 2000;
          }
          if(mdaynum == -1)
            dignext = DATE_MDAY;
        }

        if(!found)
          return PARSEDATE_FAIL;

        date = end;
      }
    }

    part++;
  }

  if(-1 == secnum)
    secnum = minnum = hournum = 0; /* no time, make it zero */

  if((-1 == mdaynum) ||
     (-1 == monnum) ||
     (-1 == yearnum))
    /* lacks vital info, fail */
    return PARSEDATE_FAIL;

#ifdef HAVE_TIME_T_UNSIGNED
  if(yearnum < 1970) {
    /* only positive numbers cannot return earlier */
    *output = TIME_T_MIN;
    return PARSEDATE_SOONER;
  }
#endif

#if (SIZEOF_TIME_T < 5)

#ifdef HAVE_TIME_T_UNSIGNED
  /* an unsigned 32 bit time_t can only hold dates to 2106 */
  if(yearnum > 2105) {
    *output = TIME_T_MAX;
    return PARSEDATE_LATER;
  }
#else
  /* a signed 32 bit time_t can only hold dates to the beginning of 2038 */
  if(yearnum > 2037) {
    *output = TIME_T_MAX;
    return PARSEDATE_LATER;
  }
  if(yearnum < 1903) {
    *output = TIME_T_MIN;
    return PARSEDATE_SOONER;
  }
#endif

#else
  /* The Gregorian calendar was introduced 1582 */
  if(yearnum < 1583)
    return PARSEDATE_FAIL;
#endif

  if((mdaynum > 31) || (monnum > 11) ||
     (hournum > 23) || (minnum > 59) || (secnum > 60))
    return PARSEDATE_FAIL; /* clearly an illegal date */

  /* time2epoch() returns a time_t. time_t is often 32 bits, sometimes even on
     architectures that feature 64 bit 'long' but ultimately time_t is the
     correct data type to use.
  */
  t = time2epoch(secnum, minnum, hournum, mdaynum, monnum, yearnum);

  /* Add the time zone diff between local time zone and GMT. */
  if(tzoff == -1)
    tzoff = 0;

  if((tzoff > 0) && (t > TIME_T_MAX - tzoff)) {
    *output = TIME_T_MAX;
    return PARSEDATE_LATER; /* time_t overflow */
  }

  t += tzoff;

  *output = t;

  return PARSEDATE_OK;
}